

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemeditorfactory.cpp
# Opt level: O2

QByteArray * __thiscall
QDefaultItemEditorFactory::valuePropertyName
          (QByteArray *__return_storage_ptr__,QDefaultItemEditorFactory *this,int userType)

{
  char *pcVar1;
  
  if (userType - 1U < 0x10) {
    pcVar1 = &DAT_00672788 + *(int *)(&DAT_00672788 + (ulong)(userType - 1U) * 4);
  }
  else {
    pcVar1 = "text";
  }
  QByteArray::QByteArray(__return_storage_ptr__,pcVar1,-1);
  return __return_storage_ptr__;
}

Assistant:

QByteArray QDefaultItemEditorFactory::valuePropertyName(int userType) const
{
    switch (userType) {
#if QT_CONFIG(combobox)
    case QMetaType::Bool:
        return "currentIndex";
#endif
#if QT_CONFIG(spinbox)
    case QMetaType::UInt:
    case QMetaType::Int:
    case QMetaType::Double:
        return "value";
#endif
#if QT_CONFIG(datetimeedit)
    case QMetaType::QDate:
        return "date";
    case QMetaType::QTime:
        return "time";
    case QMetaType::QDateTime:
        return "dateTime";
#endif
    case QMetaType::QString:
    default:
        // the default editor is a lineedit
        return "text";
    }
}